

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool.cxx
# Opt level: O2

bool __thiscall
cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *libs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *rpaths)

{
  cmRuntimeDependencyArchive *this_00;
  bool bVar1;
  int iVar2;
  cmUVProcessChainBuilder *this_01;
  istream *piVar3;
  ostream *poVar4;
  RegularExpressionMatch *this_02;
  allocator<char> local_309;
  cmBinUtilsMacOSMachOGetRuntimeDependenciesTool *local_308;
  cmUVProcessChain process;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string line;
  RegularExpressionMatch pathMatch;
  cmUVProcessChainBuilder builder;
  ostringstream e;
  
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool).Archive;
  local_308 = &this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"otool",(allocator<char> *)&pathMatch);
  bVar1 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,(string *)&e,&command);
  std::__cxx11::string::~string((string *)&e);
  if (bVar1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
               (char (*) [3])0x646c5d);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,file);
    cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
    this_01 = cmUVProcessChainBuilder::SetBuiltinStream(&builder,Stream_OUTPUT);
    cmUVProcessChainBuilder::AddCommand(this_01,&command);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&process);
    bVar1 = cmUVProcessChain::Valid(&process);
    if (bVar1) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
          ::rpathRegex == '\0') {
        iVar2 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::rpathRegex);
        if (iVar2 != 0) {
          cmsys::RegularExpression::RegularExpression(&GetFileInfo::rpathRegex,"^ *cmd LC_RPATH$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::rpathRegex,
                       &__dso_handle);
          __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                               ::rpathRegex);
        }
      }
      if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
          ::loadDylibRegex == '\0') {
        iVar2 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::loadDylibRegex);
        if (iVar2 != 0) {
          cmsys::RegularExpression::RegularExpression
                    (&GetFileInfo::loadDylibRegex,"^ *cmd LC_LOAD(_WEAK)?_DYLIB$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::loadDylibRegex,
                       &__dso_handle);
          __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                               ::loadDylibRegex);
        }
      }
      if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
          ::pathRegex == '\0') {
        iVar2 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::pathRegex);
        if (iVar2 != 0) {
          cmsys::RegularExpression::RegularExpression
                    (&GetFileInfo::pathRegex,"^ *path (.*) \\(offset [0-9]+\\)$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::pathRegex,
                       &__dso_handle);
          __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                               ::pathRegex);
        }
      }
      if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
          ::nameRegex == '\0') {
        iVar2 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::nameRegex);
        if (iVar2 != 0) {
          cmsys::RegularExpression::RegularExpression
                    (&GetFileInfo::nameRegex,"^ *name (.*) \\(offset [0-9]+\\)$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::nameRegex,
                       &__dso_handle);
          __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                               ::nameRegex);
        }
      }
LAB_00450935:
      piVar3 = cmUVProcessChain::OutputStream(&process);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (piVar3,(string *)&line);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
        memset((RegularExpressionMatch *)&e,0,0xa8);
        bVar1 = cmsys::RegularExpression::find
                          (&GetFileInfo::rpathRegex,line._M_dataplus._M_p,
                           (RegularExpressionMatch *)&e);
        if (!bVar1) goto LAB_00450a16;
        piVar3 = cmUVProcessChain::OutputStream(&process);
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (piVar3,(string *)&line);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
LAB_00450c39:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pathMatch,"Invalid output from otool",(allocator<char> *)&status);
          cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_308,(string *)&pathMatch);
          goto LAB_00450d06;
        }
        piVar3 = cmUVProcessChain::OutputStream(&process);
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (piVar3,(string *)&line);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) goto LAB_00450c39;
        memset(&pathMatch,0,0xa8);
        bVar1 = cmsys::RegularExpression::find
                          (&GetFileInfo::pathRegex,line._M_dataplus._M_p,&pathMatch);
        if (!bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&status,"Invalid output from otool",&local_309);
          cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_308,(string *)&status);
          goto LAB_00450d5c;
        }
        cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&status,&pathMatch,1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)rpaths,
                   (string *)&status);
        goto LAB_00450ac2;
      }
      bVar1 = cmUVProcessChain::Wait(&process,-1);
      if (bVar1) {
        cmUVProcessChain::GetStatus(&status,&process);
        if ((*status.
              super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
              ._M_impl.super__Vector_impl_data._M_start == (Status *)0x0) ||
           ((*status.
              super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->ExitStatus != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar4 = std::operator<<((ostream *)&e,"Failed to run otool on:\n  ");
          std::operator<<(poVar4,(string *)file);
          std::__cxx11::stringbuf::str();
          cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_308,(string *)&pathMatch);
          std::__cxx11::string::~string((string *)&pathMatch);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          bVar1 = false;
        }
        else {
          bVar1 = true;
        }
        std::
        _Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
        ::~_Vector_base(&status.
                         super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                       );
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar4 = std::operator<<((ostream *)&e,"Failed to wait on otool process for:\n  ");
        std::operator<<(poVar4,(string *)file);
        std::__cxx11::stringbuf::str();
        cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_308,(string *)&pathMatch);
        std::__cxx11::string::~string((string *)&pathMatch);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_00450d66:
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&line);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar4 = std::operator<<((ostream *)&e,"Failed to start otool process for:\n  ");
      std::operator<<(poVar4,(string *)file);
      std::__cxx11::stringbuf::str();
      cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_308,(string *)&pathMatch);
      std::__cxx11::string::~string((string *)&pathMatch);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      bVar1 = false;
    }
    cmUVProcessChain::~cmUVProcessChain(&process);
    std::
    vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
    ::~vector(&builder.Processes);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"Could not find otool",(allocator<char> *)&pathMatch);
    cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_308,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    bVar1 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&command);
  return bVar1;
LAB_00450a16:
  bVar1 = cmsys::RegularExpression::find
                    (&GetFileInfo::loadDylibRegex,line._M_dataplus._M_p,(RegularExpressionMatch *)&e
                    );
  if (!bVar1) goto LAB_00450935;
  piVar3 = cmUVProcessChain::OutputStream(&process);
  piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar3,(string *)&line);
  if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
    piVar3 = cmUVProcessChain::OutputStream(&process);
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar3,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
      memset(&pathMatch,0,0xa8);
      bVar1 = cmsys::RegularExpression::find
                        (&GetFileInfo::nameRegex,line._M_dataplus._M_p,&pathMatch);
      if (bVar1) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&status,&pathMatch,1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)libs,
                   (string *)&status);
LAB_00450ac2:
        std::__cxx11::string::~string((string *)&status);
        goto LAB_00450935;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&status,"Invalid output from otool",&local_309);
      cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_308,(string *)&status);
LAB_00450d5c:
      this_02 = (RegularExpressionMatch *)&status;
      goto LAB_00450d61;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pathMatch,"Invalid output from otool",(allocator<char> *)&status);
  cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError(local_308,(string *)&pathMatch);
LAB_00450d06:
  this_02 = &pathMatch;
LAB_00450d61:
  std::__cxx11::string::~string((string *)this_02);
  goto LAB_00450d66;
}

Assistant:

bool cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo(
  std::string const& file, std::vector<std::string>& libs,
  std::vector<std::string>& rpaths)
{
  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("otool", command)) {
    this->SetError("Could not find otool");
    return false;
  }
  command.emplace_back("-l");
  command.emplace_back(file);

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid()) {
    std::ostringstream e;
    e << "Failed to start otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression rpathRegex("^ *cmd LC_RPATH$");
  static const cmsys::RegularExpression loadDylibRegex(
    "^ *cmd LC_LOAD(_WEAK)?_DYLIB$");
  static const cmsys::RegularExpression pathRegex(
    "^ *path (.*) \\(offset [0-9]+\\)$");
  static const cmsys::RegularExpression nameRegex(
    "^ *name (.*) \\(offset [0-9]+\\)$");
  while (std::getline(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch cmdMatch;
    if (rpathRegex.find(line.c_str(), cmdMatch)) {
      if (!std::getline(*process.OutputStream(), line) ||
          !std::getline(*process.OutputStream(), line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch pathMatch;
      if (pathRegex.find(line.c_str(), pathMatch)) {
        rpaths.push_back(pathMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    } else if (loadDylibRegex.find(line.c_str(), cmdMatch)) {
      if (!std::getline(*process.OutputStream(), line) ||
          !std::getline(*process.OutputStream(), line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch nameMatch;
      if (nameRegex.find(line.c_str(), nameMatch)) {
        libs.push_back(nameMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run otool on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}